

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O3

void LDSketch_write_plaintext(LDSketch_t *sk,char *outfile)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  uchar *keys;
  longlong lVar5;
  long in_RCX;
  long extraout_RDX;
  size_t nmemb;
  int iVar6;
  char *thresh;
  int *in_R8;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint64_t key_int;
  int iStack_c8;
  long *aplStack_88 [2];
  long alStack_78 [2];
  LDSketch_t *pLStack_68;
  uchar local_38 [8];
  
  thresh = "w";
  __stream = fopen(outfile,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"Worker: %u, length of key: %d\n",(ulong)sk->tbl_id,(ulong)(uint)sk->lgn);
    fprintf(__stream,"# of hash row: %d\n",(ulong)(uint)sk->h);
    fprintf(__stream,"# of buckets: %d\n",(ulong)(uint)sk->w);
    builtin_memcpy(local_38,"\b\a\x06\x05\x04\x03\x02\x01",8);
    if (0 < sk->h) {
      iVar6 = 0;
      do {
        uVar1 = LDSketch_find(sk,local_38,0,sk->lgn + -1,iVar6);
        fprintf(__stream,"%u ",(ulong)uVar1);
        iVar6 = iVar6 + 1;
      } while (iVar6 < sk->h);
    }
    fputc(10,__stream);
    if (0 < sk->h) {
      iVar6 = 0;
      do {
        iVar2 = sk->w;
        if (0 < iVar2) {
          iVar8 = 0;
          do {
            lVar5 = sk->tbl[(uint)(iVar2 * iVar6 + iVar8)]->total;
            uVar1 = dyn_tbl_length(sk->tbl[(uint)(iVar2 * iVar6 + iVar8)]);
            fprintf(__stream,"%lld %d, ",lVar5,(ulong)uVar1);
            iVar8 = iVar8 + 1;
            iVar2 = sk->w;
          } while (iVar8 < iVar2);
        }
        fputc(10,__stream);
        iVar6 = iVar6 + 1;
      } while (iVar6 < sk->h);
    }
    fclose(__stream);
    return;
  }
  LDSketch_write_plaintext();
  iVar6 = ((LDSketch_t *)outfile)->h;
  iVar2 = ((LDSketch_t *)outfile)->w;
  nmemb = 0;
  pLStack_68 = sk;
  if (0 < iVar6 * iVar2) {
    lVar10 = 0;
    do {
      if ((long)thresh <= ((LDSketch_t *)outfile)->tbl[lVar10]->max_value) {
        uVar1 = dyn_tbl_length(((LDSketch_t *)outfile)->tbl[lVar10]);
        if ((int)nmemb < (int)uVar1) {
          nmemb = (size_t)uVar1;
        }
        iVar6 = ((LDSketch_t *)outfile)->h;
        iVar2 = ((LDSketch_t *)outfile)->w;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6 * iVar2);
  }
  iVar6 = ((LDSketch_t *)outfile)->lgn;
  aplStack_88[0] = alStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_88,"tmp heavy keys","");
  iVar2 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar2 = iVar6;
  }
  keys = (uchar *)safe_calloc(nmemb,(long)(iVar2 >> 3),(char *)aplStack_88[0]);
  if (aplStack_88[0] != alStack_78) {
    operator_delete(aplStack_88[0],alStack_78[0] + 1);
  }
  if (((LDSketch_t *)outfile)->h * ((LDSketch_t *)outfile)->w < 1) {
    iStack_c8 = 0;
  }
  else {
    lVar10 = 0;
    iStack_c8 = 0;
    do {
      if ((long)thresh <= ((LDSketch_t *)outfile)->tbl[lVar10]->max_value) {
        dyn_tbl_get_heavy_key
                  (((LDSketch_t *)outfile)->tbl[lVar10],(longlong)thresh,keys,(int *)aplStack_88);
        if (0 < (int)aplStack_88[0]) {
          iVar6 = 0;
          do {
            iVar2 = ((LDSketch_t *)outfile)->lgn;
            iVar3 = iVar2 * iVar6;
            iVar8 = iVar3 + 7;
            if (-1 < iVar3) {
              iVar8 = iVar3;
            }
            if (0 < iStack_c8) {
              iVar3 = iVar2 + 7;
              if (-1 < iVar2) {
                iVar3 = iVar2;
              }
              iVar9 = 0;
              iVar7 = iStack_c8;
              do {
                iVar4 = iVar9 + 7;
                if (-1 < iVar9) {
                  iVar4 = iVar9;
                }
                iVar4 = bcmp(keys + (iVar8 >> 3),(void *)((iVar4 >> 3) + extraout_RDX),
                             (long)(iVar3 >> 3));
                if (iVar4 == 0) goto LAB_00104f8e;
                iVar9 = iVar9 + iVar2;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            lVar5 = LDSketch_up_estimate((LDSketch_t *)outfile,keys + (iVar8 >> 3));
            if ((long)thresh <= lVar5) {
              iVar2 = ((LDSketch_t *)outfile)->lgn;
              iVar3 = iVar2 * iStack_c8;
              iVar8 = iVar3 + 7;
              if (-1 < iVar3) {
                iVar8 = iVar3;
              }
              iVar7 = iVar2 * iVar6;
              iVar3 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar3 = iVar7;
              }
              iVar7 = iVar2 + 7;
              if (-1 < iVar2) {
                iVar7 = iVar2;
              }
              memcpy((void *)((iVar8 >> 3) + extraout_RDX),keys + (iVar3 >> 3),(long)(iVar7 >> 3));
              *(longlong *)(in_RCX + (long)iStack_c8 * 8) = lVar5;
              iStack_c8 = iStack_c8 + 1;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (int)aplStack_88[0]);
        }
      }
LAB_00104f8e:
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)((LDSketch_t *)outfile)->h * (long)((LDSketch_t *)outfile)->w);
  }
  *in_R8 = iStack_c8;
  return;
}

Assistant:

void LDSketch_write_plaintext(LDSketch_t* sk, const char* outfile) {
	FILE* fp;
	int i, j;

	// open a file
	if ((fp = fopen(outfile, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", outfile);
		exit(-1);
	}

	// write to a file (including n and bd???)
	fprintf(fp, "Worker: %u, length of key: %d\n", sk->tbl_id, sk->lgn);
	fprintf(fp, "# of hash row: %d\n", sk->h);
	fprintf(fp, "# of buckets: %d\n", sk->w);

	uint64_t key_int = 0x0102030405060708;
	unsigned char* key = (unsigned char*)&key_int;
	for (i = 0; i < sk->h; ++i) {
		unsigned int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		fprintf(fp, "%u ", k);
	}
	fprintf(fp, "\n");

	for (i = 0; i < sk->h; ++i) {
		for (j = 0; j < sk->w; ++j) {
			// fprintf(fp, "%lld ", tbl->T[tbl->w*i + j]);
			unsigned int index = sk->w * i + j;
			fprintf(fp, "%lld %d, ", sk->tbl[index]->total,
				dyn_tbl_length(sk->tbl[index]));
		}
		fprintf(fp, "\n");
	}

	// close the file
	fclose(fp);
}